

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O2

ssh_key * eddsa_new_priv(ssh_keyalg *alg,ptrlen pub,ptrlen priv)

{
  ssh_key *psVar1;
  ssh_keyalg *psVar2;
  ptrlen bytes;
  BinarySource src [1];
  BinarySource local_48;
  
  psVar1 = eddsa_new_pub(alg,pub);
  if (psVar1 != (ssh_key *)0x0) {
    local_48.pos = 0;
    local_48.err = BSE_NO_ERROR;
    local_48.data = priv.ptr;
    local_48.len = priv.len;
    local_48.binarysource_ = &local_48;
    bytes = BinarySource_get_string(&local_48);
    psVar2 = (ssh_keyalg *)mp_from_bytes_le(bytes);
    psVar1[-1].vt = psVar2;
  }
  return psVar1;
}

Assistant:

static ssh_key *eddsa_new_priv(const ssh_keyalg *alg, ptrlen pub, ptrlen priv)
{
    ssh_key *sshk = eddsa_new_pub(alg, pub);
    if (!sshk)
        return NULL;
    struct eddsa_key *ek = container_of(sshk, struct eddsa_key, sshk);

    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, priv);
    ek->privateKey = get_mp_le(src);

    return &ek->sshk;
}